

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relu_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::ReLU_x86_avx512::forward_inplace(ReLU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  int *piVar1;
  uint *puVar2;
  float fVar3;
  uint uVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined8 uVar22;
  byte bVar23;
  byte bVar24;
  int iVar25;
  uint uVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [64];
  int iVar29;
  ulong uVar30;
  uint uVar31;
  uint uVar32;
  long lVar33;
  ushort uVar34;
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [32];
  
  iVar29 = bottom_top_blob->elempack;
  if ((iVar29 == 0) || (iVar25 = (int)bottom_top_blob->elemsize << 3, iVar25 / iVar29 != 8)) {
    uVar26 = iVar29 * bottom_top_blob->w * bottom_top_blob->h * bottom_top_blob->d;
    uVar4 = bottom_top_blob->c;
    if ((this->super_ReLU).slope == 0.0) {
      if (0 < (int)uVar4) {
        uVar27 = 0;
        auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
        auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
        do {
          pauVar28 = (undefined1 (*) [64])
                     (bottom_top_blob->cstep * uVar27 * bottom_top_blob->elemsize +
                     (long)bottom_top_blob->data);
          if ((int)uVar26 < 0x10) {
            uVar32 = 0;
          }
          else {
            iVar29 = 0xf;
            do {
              auVar37 = vmaxps_avx512f(ZEXT464(0) << 0x40,*pauVar28);
              *pauVar28 = auVar37;
              pauVar28 = pauVar28 + 1;
              iVar29 = iVar29 + 0x10;
              uVar32 = uVar26 & 0xfffffff0;
            } while (iVar29 < (int)uVar26);
          }
          uVar31 = uVar32 | 7;
          while ((int)uVar31 < (int)uVar26) {
            auVar41 = vmaxps_avx(ZEXT832(0),*(undefined1 (*) [32])*pauVar28);
            *(undefined1 (*) [32])*pauVar28 = auVar41;
            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x20);
            uVar31 = uVar32 + 0xf;
            uVar32 = uVar32 + 8;
          }
          uVar31 = uVar32 | 3;
          while ((int)uVar31 < (int)uVar26) {
            auVar40 = vmaxps_avx(ZEXT816(0),*(undefined1 (*) [16])*pauVar28);
            *(undefined1 (*) [16])*pauVar28 = auVar40;
            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x10);
            uVar31 = uVar32 + 7;
            uVar32 = uVar32 + 4;
          }
          if ((int)uVar32 < (int)uVar26) {
            auVar37 = vpbroadcastq_avx512f();
            uVar30 = 0;
            do {
              auVar38 = vpbroadcastq_avx512f();
              auVar39 = vporq_avx512f(auVar38,auVar35);
              auVar38 = vporq_avx512f(auVar38,auVar36);
              uVar22 = vpcmpuq_avx512f(auVar38,auVar37,2);
              bVar23 = (byte)uVar22;
              uVar22 = vpcmpuq_avx512f(auVar39,auVar37,2);
              bVar24 = (byte)uVar22;
              uVar34 = CONCAT11(bVar24,bVar23);
              piVar1 = (int *)(*pauVar28 + uVar30 * 4);
              auVar39._4_4_ = (uint)((byte)(uVar34 >> 1) & 1) * piVar1[1];
              auVar39._0_4_ = (uint)(bVar23 & 1) * *piVar1;
              auVar39._8_4_ = (uint)((byte)(uVar34 >> 2) & 1) * piVar1[2];
              auVar39._12_4_ = (uint)((byte)(uVar34 >> 3) & 1) * piVar1[3];
              auVar39._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * piVar1[4];
              auVar39._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * piVar1[5];
              auVar39._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * piVar1[6];
              auVar39._28_4_ = (uint)((byte)(uVar34 >> 7) & 1) * piVar1[7];
              auVar39._32_4_ = (uint)(bVar24 & 1) * piVar1[8];
              auVar39._36_4_ = (uint)(bVar24 >> 1 & 1) * piVar1[9];
              auVar39._40_4_ = (uint)(bVar24 >> 2 & 1) * piVar1[10];
              auVar39._44_4_ = (uint)(bVar24 >> 3 & 1) * piVar1[0xb];
              auVar39._48_4_ = (uint)(bVar24 >> 4 & 1) * piVar1[0xc];
              auVar39._52_4_ = (uint)(bVar24 >> 5 & 1) * piVar1[0xd];
              auVar39._56_4_ = (uint)(bVar24 >> 6 & 1) * piVar1[0xe];
              auVar39._60_4_ = (uint)(bVar24 >> 7) * piVar1[0xf];
              auVar38 = vmaxps_avx512f(auVar39,ZEXT464(0) << 0x40);
              puVar2 = (uint *)(*pauVar28 + uVar30 * 4);
              bVar5 = (bool)((byte)(uVar34 >> 1) & 1);
              bVar6 = (bool)((byte)(uVar34 >> 2) & 1);
              bVar7 = (bool)((byte)(uVar34 >> 3) & 1);
              bVar8 = (bool)((byte)(uVar34 >> 4) & 1);
              bVar9 = (bool)((byte)(uVar34 >> 5) & 1);
              bVar10 = (bool)((byte)(uVar34 >> 6) & 1);
              bVar11 = (bool)((byte)(uVar34 >> 7) & 1);
              bVar12 = (bool)(bVar24 >> 1 & 1);
              bVar13 = (bool)(bVar24 >> 2 & 1);
              bVar14 = (bool)(bVar24 >> 3 & 1);
              bVar15 = (bool)(bVar24 >> 4 & 1);
              bVar16 = (bool)(bVar24 >> 5 & 1);
              bVar17 = (bool)(bVar24 >> 6 & 1);
              *puVar2 = (uint)(bVar23 & 1) * auVar38._0_4_ | (uint)!(bool)(bVar23 & 1) * *puVar2;
              puVar2[1] = (uint)bVar5 * auVar38._4_4_ | (uint)!bVar5 * puVar2[1];
              puVar2[2] = (uint)bVar6 * auVar38._8_4_ | (uint)!bVar6 * puVar2[2];
              puVar2[3] = (uint)bVar7 * auVar38._12_4_ | (uint)!bVar7 * puVar2[3];
              puVar2[4] = (uint)bVar8 * auVar38._16_4_ | (uint)!bVar8 * puVar2[4];
              puVar2[5] = (uint)bVar9 * auVar38._20_4_ | (uint)!bVar9 * puVar2[5];
              puVar2[6] = (uint)bVar10 * auVar38._24_4_ | (uint)!bVar10 * puVar2[6];
              puVar2[7] = (uint)bVar11 * auVar38._28_4_ | (uint)!bVar11 * puVar2[7];
              puVar2[8] = (uint)(bVar24 & 1) * auVar38._32_4_ |
                          (uint)!(bool)(bVar24 & 1) * puVar2[8];
              puVar2[9] = (uint)bVar12 * auVar38._36_4_ | (uint)!bVar12 * puVar2[9];
              puVar2[10] = (uint)bVar13 * auVar38._40_4_ | (uint)!bVar13 * puVar2[10];
              puVar2[0xb] = (uint)bVar14 * auVar38._44_4_ | (uint)!bVar14 * puVar2[0xb];
              puVar2[0xc] = (uint)bVar15 * auVar38._48_4_ | (uint)!bVar15 * puVar2[0xc];
              puVar2[0xd] = (uint)bVar16 * auVar38._52_4_ | (uint)!bVar16 * puVar2[0xd];
              puVar2[0xe] = (uint)bVar17 * auVar38._56_4_ | (uint)!bVar17 * puVar2[0xe];
              puVar2[0xf] = (uint)(bVar24 >> 7) * auVar38._60_4_ |
                            (uint)!(bool)(bVar24 >> 7) * puVar2[0xf];
              uVar30 = uVar30 + 0x10;
            } while (((ulong)(~uVar32 + uVar26) + 0x10 & 0xfffffffffffffff0) != uVar30);
          }
          uVar27 = uVar27 + 1;
        } while (uVar27 != uVar4);
      }
    }
    else if (0 < (int)uVar4) {
      uVar27 = 0;
      do {
        pauVar28 = (undefined1 (*) [64])
                   (bottom_top_blob->cstep * uVar27 * bottom_top_blob->elemsize +
                   (long)bottom_top_blob->data);
        if ((int)uVar26 < 0x10) {
          uVar32 = 0;
        }
        else {
          auVar35 = vbroadcastss_avx512f(ZEXT416((uint)(this->super_ReLU).slope));
          iVar29 = 0xf;
          do {
            auVar36 = *pauVar28;
            uVar30 = vcmpps_avx512f(auVar36,ZEXT464(0) << 0x40,1);
            auVar37 = vmulps_avx512f(auVar36,auVar35);
            bVar5 = (bool)((byte)uVar30 & 1);
            auVar38._0_4_ = (uint)bVar5 * auVar37._0_4_ | (uint)!bVar5 * auVar36._0_4_;
            bVar5 = (bool)((byte)(uVar30 >> 1) & 1);
            auVar38._4_4_ = (uint)bVar5 * auVar37._4_4_ | (uint)!bVar5 * auVar36._4_4_;
            bVar5 = (bool)((byte)(uVar30 >> 2) & 1);
            auVar38._8_4_ = (uint)bVar5 * auVar37._8_4_ | (uint)!bVar5 * auVar36._8_4_;
            bVar5 = (bool)((byte)(uVar30 >> 3) & 1);
            auVar38._12_4_ = (uint)bVar5 * auVar37._12_4_ | (uint)!bVar5 * auVar36._12_4_;
            bVar5 = (bool)((byte)(uVar30 >> 4) & 1);
            auVar38._16_4_ = (uint)bVar5 * auVar37._16_4_ | (uint)!bVar5 * auVar36._16_4_;
            bVar5 = (bool)((byte)(uVar30 >> 5) & 1);
            auVar38._20_4_ = (uint)bVar5 * auVar37._20_4_ | (uint)!bVar5 * auVar36._20_4_;
            bVar5 = (bool)((byte)(uVar30 >> 6) & 1);
            auVar38._24_4_ = (uint)bVar5 * auVar37._24_4_ | (uint)!bVar5 * auVar36._24_4_;
            bVar5 = (bool)((byte)(uVar30 >> 7) & 1);
            auVar38._28_4_ = (uint)bVar5 * auVar37._28_4_ | (uint)!bVar5 * auVar36._28_4_;
            bVar5 = (bool)((byte)(uVar30 >> 8) & 1);
            auVar38._32_4_ = (uint)bVar5 * auVar37._32_4_ | (uint)!bVar5 * auVar36._32_4_;
            bVar5 = (bool)((byte)(uVar30 >> 9) & 1);
            auVar38._36_4_ = (uint)bVar5 * auVar37._36_4_ | (uint)!bVar5 * auVar36._36_4_;
            bVar5 = (bool)((byte)(uVar30 >> 10) & 1);
            auVar38._40_4_ = (uint)bVar5 * auVar37._40_4_ | (uint)!bVar5 * auVar36._40_4_;
            bVar5 = (bool)((byte)(uVar30 >> 0xb) & 1);
            auVar38._44_4_ = (uint)bVar5 * auVar37._44_4_ | (uint)!bVar5 * auVar36._44_4_;
            bVar5 = (bool)((byte)(uVar30 >> 0xc) & 1);
            auVar38._48_4_ = (uint)bVar5 * auVar37._48_4_ | (uint)!bVar5 * auVar36._48_4_;
            bVar5 = (bool)((byte)(uVar30 >> 0xd) & 1);
            auVar38._52_4_ = (uint)bVar5 * auVar37._52_4_ | (uint)!bVar5 * auVar36._52_4_;
            bVar5 = (bool)((byte)(uVar30 >> 0xe) & 1);
            auVar38._56_4_ = (uint)bVar5 * auVar37._56_4_ | (uint)!bVar5 * auVar36._56_4_;
            bVar5 = SUB81(uVar30 >> 0xf,0);
            auVar38._60_4_ = (uint)bVar5 * auVar37._60_4_ | (uint)!bVar5 * auVar36._60_4_;
            *pauVar28 = auVar38;
            pauVar28 = pauVar28 + 1;
            iVar29 = iVar29 + 0x10;
            uVar32 = uVar26 & 0xfffffff0;
          } while (iVar29 < (int)uVar26);
        }
        if ((int)(uVar32 | 7) < (int)uVar26) {
          fVar3 = (this->super_ReLU).slope;
          auVar41._4_4_ = fVar3;
          auVar41._0_4_ = fVar3;
          auVar41._8_4_ = fVar3;
          auVar41._12_4_ = fVar3;
          auVar41._16_4_ = fVar3;
          auVar41._20_4_ = fVar3;
          auVar41._24_4_ = fVar3;
          auVar41._28_4_ = fVar3;
          uVar31 = uVar32;
          do {
            auVar19 = vmaxps_avx(*(undefined1 (*) [32])*pauVar28,ZEXT832(0));
            auVar21 = vminps_avx(*(undefined1 (*) [32])*pauVar28,ZEXT832(0));
            auVar40 = vfmadd213ps_fma(auVar21,auVar41,auVar19);
            *(undefined1 (*) [32])*pauVar28 = ZEXT1632(auVar40);
            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x20);
            uVar32 = uVar31 + 8;
            iVar29 = uVar31 + 0xf;
            uVar31 = uVar32;
          } while (iVar29 < (int)uVar26);
        }
        if ((int)(uVar32 | 3) < (int)uVar26) {
          fVar3 = (this->super_ReLU).slope;
          auVar40._4_4_ = fVar3;
          auVar40._0_4_ = fVar3;
          auVar40._8_4_ = fVar3;
          auVar40._12_4_ = fVar3;
          uVar31 = uVar32;
          do {
            auVar18 = vmaxps_avx(*(undefined1 (*) [16])*pauVar28,ZEXT816(0));
            auVar20 = vminps_avx(*(undefined1 (*) [16])*pauVar28,ZEXT816(0));
            auVar18 = vfmadd213ps_fma(auVar20,auVar40,auVar18);
            *(undefined1 (*) [16])*pauVar28 = auVar18;
            pauVar28 = (undefined1 (*) [64])(*pauVar28 + 0x10);
            uVar32 = uVar31 + 4;
            iVar29 = uVar31 + 7;
            uVar31 = uVar32;
          } while (iVar29 < (int)uVar26);
        }
        if (uVar26 - uVar32 != 0 && (int)uVar32 <= (int)uVar26) {
          lVar33 = 0;
          do {
            if (*(float *)(*pauVar28 + lVar33 * 4) < 0.0) {
              *(float *)(*pauVar28 + lVar33 * 4) =
                   *(float *)(*pauVar28 + lVar33 * 4) * (this->super_ReLU).slope;
            }
            lVar33 = lVar33 + 1;
          } while (uVar26 - uVar32 != (int)lVar33);
        }
        uVar27 = uVar27 + 1;
      } while (uVar27 != uVar4);
    }
  }
  else {
    forward_inplace_int8(this,bottom_top_blob,(Option *)((long)iVar25 % (long)iVar29 & 0xffffffff));
  }
  return 0;
}

Assistant:

int ReLU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int elembits = bottom_top_blob.elembits();

    if (elembits == 8)
        return forward_inplace_int8(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    if (slope == 0.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, _mm512_max_ps(_zero_avx512, _p));
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, _mm256_max_ps(_zero_avx, _p));
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                _mm_store_ps(ptr, _mm_max_ps(_zero, _p));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *ptr = std::max(*ptr, 0.f);
                ptr++;
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            __m512 _zero_avx512 = _mm512_setzero_ps();
            __m512 _slope_avx512 = _mm512_set1_ps(slope);
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __mmask16 _is_negative = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_LT_OQ);
                _p = _mm512_mask_mul_ps(_p, _is_negative, _p, _slope_avx512);
                _mm512_storeu_ps(ptr, _p);
                ptr += 16;
            }
#endif // __AVX512F__
            __m256 _zero_avx = _mm256_setzero_ps();
            __m256 _slope_avx = _mm256_set1_ps(slope);
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _pos = _mm256_max_ps(_zero_avx, _p);
                __m256 _neg = _mm256_min_ps(_zero_avx, _p);
                _p = _mm256_add_ps(_pos, _mm256_mul_ps(_slope_avx, _neg));
                _mm256_storeu_ps(ptr, _p);
                ptr += 8;
            }
#endif // __AVX__
            __m128 _zero = _mm_setzero_ps();
            __m128 _slope = _mm_set1_ps(slope);
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _pos = _mm_max_ps(_zero, _p);
                __m128 _neg = _mm_min_ps(_zero, _p);
                _p = _mm_add_ps(_pos, _mm_mul_ps(_slope, _neg));
                _mm_store_ps(ptr, _p);
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}